

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

void __thiscall ON_ClippingPlaneData::ON_ClippingPlaneData(ON_ClippingPlaneData *this)

{
  this->m_sn = 0;
  this->m_depth = 0.0;
  ON_UuidList::ON_UuidList(&this->m_object_id_list,0);
  (this->m_layer_list)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
  (this->m_layer_list).m_a = (int *)0x0;
  (this->m_layer_list).m_count = 0;
  (this->m_layer_list).m_capacity = 0;
  this->m_layer_list_is_sorted = true;
  this->m_is_exclusion_list = true;
  return;
}

Assistant:

ON_ClippingPlaneData():m_object_id_list(0){}